

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtCentroidCase::init
          (InterpolateAtCentroidCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  MessageBuilder local_190;
  
  if (this->m_type == TEST_ARRAY_ELEMENT) {
    local_190.m_log =
         ((this->super_CentroidRenderCase).super_MultisampleRenderCase.super_TestCase.super_TestCase
          .super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.m_str);
    std::operator<<((ostream *)&local_190.m_str,
                    "Testing interpolateAtCentroid with element of array as an argument.");
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_type != TEST_CONSISTENCY) goto LAB_0043b5fe;
    local_190.m_log =
         ((this->super_CentroidRenderCase).super_MultisampleRenderCase.super_TestCase.super_TestCase
          .super_TestNode.m_testCtx)->m_log;
    this_00 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,
                    "Verifying that interpolateAtCentroid does not return different values than a corresponding centroid-qualified varying.\n"
                   );
    std::operator<<((ostream *)this_00,
                    "\tDraw a fan of narrow triangles (large number of pixels on the edges).\n");
    std::operator<<((ostream *)this_00,
                    "\tSet varyings \'barycentricsA\' and \'barycentricsB\' to contain barycentric coordinates.\n"
                   );
    std::operator<<((ostream *)this_00,"\tAdd centroid-qualifier for barycentricsB.\n");
    std::operator<<((ostream *)this_00,
                    "\t=> interpolateAtCentroid(barycentricsA) ~= barycentricsB\n");
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190.m_str);
LAB_0043b5fe:
  iVar1 = CentroidRenderCase::init(&this->super_CentroidRenderCase,ctx);
  return iVar1;
}

Assistant:

void InterpolateAtCentroidCase::init (void)
{
	// test purpose and expectations
	if (m_type == TEST_CONSISTENCY)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that interpolateAtCentroid does not return different values than a corresponding centroid-qualified varying.\n"
			<< "	Draw a fan of narrow triangles (large number of pixels on the edges).\n"
			<< "	Set varyings 'barycentricsA' and 'barycentricsB' to contain barycentric coordinates.\n"
			<< "	Add centroid-qualifier for barycentricsB.\n"
			<< "	=> interpolateAtCentroid(barycentricsA) ~= barycentricsB\n"
			<< tcu::TestLog::EndMessage;
	}
	else if (m_type == TEST_ARRAY_ELEMENT)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Testing interpolateAtCentroid with element of array as an argument."
			<< tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(false);

	CentroidRenderCase::init();
}